

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool IsReachableLoadValue(VmInstruction *user,VmInstruction *load)

{
  VmInstructionType VVar1;
  VariableData *container;
  bool bVar2;
  VmValue **ppVVar3;
  VmValue *pVVar4;
  bool bVar5;
  
  if (user->parent == load->parent) {
    ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&load->arguments,0);
    pVVar4 = *ppVVar3;
    if ((pVVar4 == (VmValue *)0x0) || (pVVar4->typeID != 1)) {
      pVVar4 = (VmValue *)0x0;
    }
    do {
      while( true ) {
        user = user->prevSibling;
        bVar5 = user == load;
        if (bVar5) {
          return bVar5;
        }
        VVar1 = user->cmd;
        if (6 < VVar1 - VM_INST_STORE_BYTE) break;
        bVar2 = anon_unknown.dwarf_20a43d::IsLoadAliasedWithStore(load,user);
        if (bVar2) {
          return bVar5;
        }
      }
      if (VVar1 - VM_INST_SET_RANGE < 2) {
        return bVar5;
      }
    } while (VVar1 != VM_INST_CALL);
    if (((pVVar4 != (VmValue *)0x0) &&
        (container = (VariableData *)pVVar4[1].comment.end, container != (VariableData *)0x0)) &&
       (bVar5 = HasAddressTaken(container), !bVar5)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool IsReachableLoadValue(VmInstruction *user, VmInstruction *load)
{
	if(user->parent != load->parent)
		return false;

	VmValue *loadAddress = load->arguments[0];

	VmConstant *loadAddressConstant = getType<VmConstant>(loadAddress);

	for(VmInstruction *curr = user->prevSibling; curr != load; curr = curr->prevSibling)
	{
		switch(curr->cmd)
		{
		case VM_INST_STORE_BYTE:
		case VM_INST_STORE_SHORT:
		case VM_INST_STORE_INT:
		case VM_INST_STORE_FLOAT:
		case VM_INST_STORE_DOUBLE:
		case VM_INST_STORE_LONG:
		case VM_INST_STORE_STRUCT:
			if(IsLoadAliasedWithStore(load, curr))
				return false;
			break;
		case VM_INST_SET_RANGE:
		case VM_INST_MEM_COPY:
			return false;
		case VM_INST_CALL:
			if(loadAddressConstant && loadAddressConstant->container && !HasAddressTaken(loadAddressConstant->container))
				return true;

			return false;
		default:
			break;
		}
	}

	return true;
}